

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nordic_itch_protocol.cc
# Opt level: O2

void __thiscall
helix::nasdaq::nordic_itch_protocol::nordic_itch_protocol(nordic_itch_protocol *this,string *name)

{
  (this->super_protocol)._vptr_protocol = (_func_int **)&PTR__nordic_itch_protocol_00128bb0;
  std::__cxx11::string::string((string *)&this->_name,(string *)name);
  return;
}

Assistant:

nordic_itch_protocol::nordic_itch_protocol(std::string name)
    : _name{std::move(name)}
{
}